

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::DisplayFinalEntries(cmComputeLinkDepends *this)

{
  pointer pLVar1;
  FILE *pFVar2;
  string *psVar3;
  pointer pLVar4;
  char *__format;
  LinkEntry *lei;
  pointer pLVar5;
  
  pFVar2 = _stderr;
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  fprintf(pFVar2,"target [%s] links to:\n",(psVar3->_M_dataplus)._M_p);
  pLVar1 = (this->FinalLinkEntries).
           super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pLVar5 = (this->FinalLinkEntries).
                super__Vector_base<cmComputeLinkDepends::LinkEntry,_std::allocator<cmComputeLinkDepends::LinkEntry>_>
                ._M_impl.super__Vector_impl_data._M_start; pFVar2 = _stderr, pLVar5 != pLVar1;
      pLVar5 = pLVar5 + 1) {
    __format = "  item [%s]\n";
    pLVar4 = pLVar5;
    if (pLVar5->Target != (cmGeneratorTarget *)0x0) {
      pLVar4 = (pointer)cmGeneratorTarget::GetName_abi_cxx11_(pLVar5->Target);
      __format = "  target [%s]\n";
    }
    fprintf(pFVar2,__format,(pLVar4->Item)._M_dataplus._M_p);
  }
  fputc(10,_stderr);
  return;
}

Assistant:

void cmComputeLinkDepends::DisplayFinalEntries()
{
  fprintf(stderr, "target [%s] links to:\n", this->Target->GetName().c_str());
  for (LinkEntry const& lei : this->FinalLinkEntries) {
    if (lei.Target) {
      fprintf(stderr, "  target [%s]\n", lei.Target->GetName().c_str());
    } else {
      fprintf(stderr, "  item [%s]\n", lei.Item.c_str());
    }
  }
  fprintf(stderr, "\n");
}